

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O3

void __thiscall
arangodb::velocypack::Validator::validateCompactObject(Validator *this,uint8_t *ptr,size_t length)

{
  byte *ptr_00;
  byte bVar1;
  ValueLength VVar2;
  ulong uVar3;
  int64_t iVar4;
  ValueLength length_00;
  ulong uVar5;
  Exception *this_00;
  char *msg;
  byte *ptr_01;
  byte *pbVar6;
  Slice key;
  byte *local_48;
  byte *local_40;
  byte *local_38;
  
  validateBufferLength(this,5,length,true);
  local_40 = ptr + 1;
  VVar2 = ReadVariableLengthValue<false>(&local_40,ptr + length + 1);
  ptr_01 = local_40;
  if ((VVar2 <= length) && (4 < VVar2)) {
    local_40 = ptr + (VVar2 - 1);
    VVar2 = ReadVariableLengthValue<true>(&local_40,ptr + VVar2);
    if (VVar2 != 0) {
      pbVar6 = local_40 + 1;
      local_40 = ptr_01;
      do {
        if (pbVar6 <= ptr_01) {
          this_00 = (Exception *)__cxa_allocate_exception(0x18);
          msg = "Object items number is out of bounds";
          goto LAB_0010c205;
        }
        validatePart(this,ptr_01,(long)pbVar6 - (long)ptr_01,true);
        bVar1 = *ptr_01;
        uVar3 = (ulong)bVar1;
        uVar5 = uVar3 - 0x40;
        local_48 = ptr_01;
        if (0x7f < uVar5) {
          if ((bVar1 & 0xf0) == 0x30) {
            iVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getSmallInt
                              ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                *)&local_48);
            if (iVar4 < 1) {
LAB_0010c1f1:
              this_00 = (Exception *)__cxa_allocate_exception(0x18);
              msg = "Invalid object key type";
              goto LAB_0010c205;
            }
            uVar3 = (ulong)*local_48;
          }
          else if ((bVar1 & 0xf8) != 0x28) goto LAB_0010c1f1;
        }
        length_00 = (ValueLength)"\x01\x01"[uVar3];
        if (length_00 == 0) {
          length_00 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                      byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                       *)&local_48,local_48);
        }
        if ((uVar5 < 0x80) && (this->options->validateUtf8Strings == true)) {
          validatePart(this,ptr_01,length_00,true);
        }
        ptr_00 = ptr_01 + length_00;
        validatePart(this,ptr_00,(long)pbVar6 - (long)ptr_00,true);
        uVar5 = (ulong)"\x01\x01"[ptr_01[length_00]];
        local_38 = ptr_00;
        if (uVar5 == 0) {
          uVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                  byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&local_38,ptr_00);
        }
        VVar2 = VVar2 - 1;
        ptr_01 = ptr_00 + uVar5;
      } while (VVar2 != 0);
      if (ptr_01 == pbVar6) {
        return;
      }
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Object has more members than specified";
      goto LAB_0010c205;
    }
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  msg = "Object length value is out of bounds";
LAB_0010c205:
  Exception::Exception(this_00,ValidatorInvalidLength,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateCompactObject(uint8_t const* ptr, std::size_t length) {
  // compact Object without index table
  validateBufferLength(5, length, true);

  uint8_t const* p = ptr + 1;
  // read byteLength
  ValueLength const byteSize = ReadVariableLengthValue<false>(p, p + length);
  if (byteSize > length || byteSize < 5) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object length value is out of bounds");
  }

  // read nrItems
  uint8_t const* data = p;
  p = ptr + byteSize - 1;
  ValueLength nrItems = ReadVariableLengthValue<true>(p, ptr + byteSize);
  if (nrItems == 0) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object length value is out of bounds");
  }
  ++p;

  // validate the object members
  uint8_t const* e = p;
  p = data;
  while (nrItems-- > 0) {
    if (p >= e) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object items number is out of bounds");
    }
    // validate key
    validatePart(p, e - p, true);
    Slice key(p);
    bool isString = key.isString();
    if (!isString) {
      bool const isSmallInt = key.isSmallInt();
      if ((!isSmallInt && !key.isUInt()) ||
          (isSmallInt && key.getSmallInt() <= 0)) {
        throw Exception(Exception::ValidatorInvalidLength,
                        "Invalid object key type");
      }
    }
    ValueLength keySize = key.byteSize();
    // validate key
    if (isString && options->validateUtf8Strings) {
      validatePart(p, keySize, true);
    }

    // validate value
    p += keySize;
    validatePart(p, e - p, true);
    p += Slice(p).byteSize();
  }

  // finally check if we are now pointing at the end or not
  if (p != e) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object has more members than specified");
  }
}